

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void __thiscall
duckdb::Executor::RescheduleTask(Executor *this,shared_ptr<duckdb::Task,_true> *task_p)

{
  mutex *__mutex;
  iterator iVar1;
  TaskScheduler *this_00;
  type token;
  element_type *local_48;
  __shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  __mutex = &this->executor_lock;
  do {
    ::std::mutex::lock(__mutex);
    if (this->cancelled != false) {
LAB_014a3cc3:
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    local_48 = (task_p->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    iVar1 = ::std::
            _Hashtable<duckdb::Task_*,_std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>,_std::allocator<std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Task_*>,_std::hash<duckdb::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->to_be_rescheduled_tasks)._M_h,&local_48);
    if (iVar1.
        super__Node_iterator_base<std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      this_00 = TaskScheduler::GetScheduler(this->context);
      local_48 = (task_p->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      ::std::
      _Hashtable<duckdb::Task_*,_std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>,_std::allocator<std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Task_*>,_std::hash<duckdb::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->to_be_rescheduled_tasks)._M_h);
      token = unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>,_true>::
              operator*(&this->producer);
      ::std::__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,(__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> *)task_p);
      TaskScheduler::ScheduleTask(this_00,token,(shared_ptr<duckdb::Task,_true> *)&local_40);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_refcount);
      ::std::condition_variable::notify_one();
      goto LAB_014a3cc3;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  } while( true );
}

Assistant:

void Executor::RescheduleTask(shared_ptr<Task> &task_p) {
	// This function will spin lock until the task provided is added to the to_be_rescheduled_tasks
	while (true) {
		lock_guard<mutex> l(executor_lock);
		if (cancelled) {
			return;
		}
		auto entry = to_be_rescheduled_tasks.find(task_p.get());
		if (entry != to_be_rescheduled_tasks.end()) {
			auto &scheduler = TaskScheduler::GetScheduler(context);
			to_be_rescheduled_tasks.erase(task_p.get());
			scheduler.ScheduleTask(GetToken(), task_p);
			SignalTaskRescheduled(l);
			break;
		}
	}
}